

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall QMessagePattern::setPattern(QMessagePattern *this,QString *pattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  __normal_iterator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>_>
  __first;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  qsizetype qVar7;
  ulong uVar8;
  type ppcVar9;
  int *piVar10;
  size_type sVar11;
  ulong uVar12;
  ulong *puVar13;
  type __result;
  QLatin1String *pQVar14;
  QString *in_RSI;
  long in_RDI;
  ulong uVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  int depth;
  qsizetype spaceIdx;
  int i_1;
  bool inIf;
  bool nestedIfError;
  int i;
  bool inPlaceholder;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  QMessageLogContext ctx;
  QRegularExpressionMatch m;
  int backtraceDepth;
  QString backtraceSeparator;
  QString lexeme_1;
  QString error;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  literalsVar;
  QChar c;
  QString lexeme;
  QList<QString> lexemes;
  BacktraceParams backtraceParams;
  undefined4 in_stack_fffffffffffff948;
  char in_stack_fffffffffffff94c;
  undefined1 in_stack_fffffffffffff94d;
  char in_stack_fffffffffffff94e;
  undefined1 in_stack_fffffffffffff94f;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffff950;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  *this_00;
  QStringView *in_stack_fffffffffffff958;
  QLatin1String *in_stack_fffffffffffff960;
  undefined6 in_stack_fffffffffffff968;
  undefined6 uVar17;
  QChar in_stack_fffffffffffff96e;
  undefined2 uVar18;
  undefined4 in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  __normal_iterator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_*,_std::vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>_>
  __last;
  undefined6 in_stack_fffffffffffff978;
  undefined6 uVar19;
  QChar in_stack_fffffffffffff97e;
  undefined2 uVar20;
  QString *in_stack_fffffffffffff980;
  qsizetype in_stack_fffffffffffff988;
  qsizetype in_stack_fffffffffffff990;
  QString *in_stack_fffffffffffff998;
  Data *in_stack_fffffffffffff9a0;
  QString *in_stack_fffffffffffff9a8;
  QRegularExpression *in_stack_fffffffffffff9b0;
  type in_stack_fffffffffffff9d8;
  bool local_4b4;
  int local_42c;
  int local_418;
  undefined1 *local_3b8;
  char *pcStack_3b0;
  char *local_3a8;
  char *pcStack_3a0;
  QRegularExpression local_378;
  char local_369;
  QLatin1StringView local_368;
  QStringView local_2a8;
  undefined1 *local_290;
  QArrayDataPointer<char16_t> local_280 [2];
  QArrayDataPointer<char16_t> local_248 [2];
  int local_214;
  QArrayDataPointer<char16_t> local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  QChar local_da;
  QString local_d8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  local_a8;
  QChar local_84;
  char16_t local_82;
  QChar local_80;
  char16_t local_7e;
  QChar local_7c;
  char16_t local_7a;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QList<QString> local_60 [2];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::clear((QList<QString> *)in_stack_fffffffffffff950);
  QList<QMessagePattern::BacktraceParams>::clear
            ((QList<QMessagePattern::BacktraceParams> *)in_stack_fffffffffffff950);
  *(undefined4 *)(in_RDI + 0x48) = 0;
  local_60[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_60[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2442af);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2442e9);
  bVar5 = false;
  for (local_418 = 0; qVar7 = QString::size(in_RSI), local_418 < qVar7; local_418 = local_418 + 1) {
    local_7a = 0xaaaa;
    local_7a = (char16_t)
               QString::at((QString *)in_stack_fffffffffffff958,(qsizetype)in_stack_fffffffffffff950
                          );
    QChar::QChar<char16_t,_true>(&local_7c,L'%');
    bVar4 = ::operator==((QChar *)in_stack_fffffffffffff950,
                         (QChar *)CONCAT17(in_stack_fffffffffffff94f,
                                           CONCAT16(in_stack_fffffffffffff94e,
                                                    CONCAT15(in_stack_fffffffffffff94d,
                                                             CONCAT14(in_stack_fffffffffffff94c,
                                                                      in_stack_fffffffffffff948)))))
    ;
    bVar3 = false;
    if (bVar4) {
      bVar3 = (bool)(bVar5 ^ 1);
    }
    if (bVar3) {
      qVar7 = QString::size(in_RSI);
      local_4b4 = false;
      if (local_418 + 1 < qVar7) {
        local_7e = (char16_t)
                   QString::at((QString *)in_stack_fffffffffffff958,
                               (qsizetype)in_stack_fffffffffffff950);
        QChar::QChar<char16_t,_true>(&local_80,L'{');
        local_4b4 = ::operator==((QChar *)in_stack_fffffffffffff950,
                                 (QChar *)CONCAT17(in_stack_fffffffffffff94f,
                                                   CONCAT16(in_stack_fffffffffffff94e,
                                                            CONCAT15(in_stack_fffffffffffff94d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
      }
      if (local_4b4 != false) {
        bVar5 = QString::isEmpty((QString *)0x244474);
        if (!bVar5) {
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffff950,
                     (parameter_type)
                     CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,
                                       CONCAT15(in_stack_fffffffffffff94d,
                                                CONCAT14(in_stack_fffffffffffff94c,
                                                         in_stack_fffffffffffff948)))));
          QString::clear((QString *)in_stack_fffffffffffff950);
        }
        bVar5 = true;
      }
    }
    local_82 = local_7a;
    QString::append((QString *)in_stack_fffffffffffff960,in_stack_fffffffffffff96e);
    QChar::QChar<char16_t,_true>(&local_84,L'}');
    bVar4 = ::operator==((QChar *)in_stack_fffffffffffff950,
                         (QChar *)CONCAT17(in_stack_fffffffffffff94f,
                                           CONCAT16(in_stack_fffffffffffff94e,
                                                    CONCAT15(in_stack_fffffffffffff94d,
                                                             CONCAT14(in_stack_fffffffffffff94c,
                                                                      in_stack_fffffffffffff948)))))
    ;
    bVar3 = bVar5;
    if (!bVar4) {
      bVar3 = false;
    }
    if (bVar3) {
      QList<QString>::append
                ((QList<QString> *)in_stack_fffffffffffff950,
                 (parameter_type)
                 CONCAT17(in_stack_fffffffffffff94f,
                          CONCAT16(in_stack_fffffffffffff94e,
                                   CONCAT15(in_stack_fffffffffffff94d,
                                            CONCAT14(in_stack_fffffffffffff94c,
                                                     in_stack_fffffffffffff948)))));
      QString::clear((QString *)in_stack_fffffffffffff950);
      bVar5 = false;
    }
  }
  bVar5 = QString::isEmpty((QString *)0x244595);
  if (!bVar5) {
    QList<QString>::append
              ((QList<QString> *)in_stack_fffffffffffff950,
               (parameter_type)
               CONCAT17(in_stack_fffffffffffff94f,
                        CONCAT16(in_stack_fffffffffffff94e,
                                 CONCAT15(in_stack_fffffffffffff94d,
                                          CONCAT14(in_stack_fffffffffffff94c,
                                                   in_stack_fffffffffffff948)))));
  }
  local_a8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.
  super__Vector_base<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  std::
  vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
  ::vector((vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
            *)0x2445e0);
  qVar7 = QList<QString>::size(local_60);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = qVar7 + 1;
  uVar8 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  operator_new__(uVar8);
  std::unique_ptr<char_const*[],std::default_delete<char_const*[]>>::reset<char_const**,void>
            ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
             in_stack_fffffffffffff950,
             (char **)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,
                                        CONCAT15(in_stack_fffffffffffff94d,
                                                 CONCAT14(in_stack_fffffffffffff94c,
                                                          in_stack_fffffffffffff948)))));
  QList<QString>::size(local_60);
  ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                      ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
                       in_stack_fffffffffffff950,
                       CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,
                                         CONCAT15(in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
  *ppcVar9 = (char *)0x0;
  bVar3 = false;
  bVar5 = false;
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2446d2);
  local_42c = 0;
  do {
    qVar7 = QList<QString>::size(local_60);
    if (qVar7 <= local_42c) {
      if (bVar3) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950);
        s_01.m_data._0_6_ = in_stack_fffffffffffff968;
        s_01.m_size = (qsizetype)in_stack_fffffffffffff960;
        s_01.m_data._6_2_ = in_stack_fffffffffffff96e.ucs;
        QString::operator+=((QString *)
                            CONCAT17(in_stack_fffffffffffff94f,
                                     CONCAT16(in_stack_fffffffffffff94e,
                                              CONCAT15(in_stack_fffffffffffff94d,
                                                       CONCAT14(in_stack_fffffffffffff94c,
                                                                in_stack_fffffffffffff948)))),s_01);
      }
      else if (bVar5) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950);
        s_02.m_data._0_6_ = in_stack_fffffffffffff968;
        s_02.m_size = (qsizetype)in_stack_fffffffffffff960;
        s_02.m_data._6_2_ = in_stack_fffffffffffff96e.ucs;
        QString::operator+=((QString *)
                            CONCAT17(in_stack_fffffffffffff94f,
                                     CONCAT16(in_stack_fffffffffffff94e,
                                              CONCAT15(in_stack_fffffffffffff94d,
                                                       CONCAT14(in_stack_fffffffffffff94c,
                                                                in_stack_fffffffffffff948)))),s_02);
      }
      bVar5 = QString::isEmpty((QString *)0x245d11);
      if (!bVar5) {
        QString::chop((QString *)in_stack_fffffffffffff950,
                      CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,
                                        CONCAT15(in_stack_fffffffffffff94d,
                                                 CONCAT14(in_stack_fffffffffffff94c,
                                                          in_stack_fffffffffffff948)))));
        local_3a8 = &DAT_aaaaaaaaaaaaaaaa;
        pcStack_3a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_3b8 = &DAT_aaaaaaaaaaaaaaaa;
        pcStack_3b0 = &DAT_aaaaaaaaaaaaaaaa;
        QMessageLogContext::QMessageLogContext
                  ((QMessageLogContext *)&local_3b8,(char *)0x0,0,"QMessagePattern::setPattern",
                   (char *)0x0);
        preformattedMessageHandler
                  ((QtMsgType)((ulong)in_stack_fffffffffffff950 >> 0x20),
                   (QMessageLogContext *)
                   CONCAT17(in_stack_fffffffffffff94f,
                            CONCAT16(in_stack_fffffffffffff94e,
                                     CONCAT15(in_stack_fffffffffffff94d,
                                              CONCAT14(in_stack_fffffffffffff94c,
                                                       in_stack_fffffffffffff948)))),
                   (QString *)0x245d7f);
      }
      sVar11 = std::
               vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
               ::size(&local_a8);
      uVar8 = sVar11 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar8;
      uVar12 = SUB168(auVar2 * ZEXT816(8),0);
      uVar15 = uVar12 + 8;
      if (0xfffffffffffffff7 < uVar12) {
        uVar15 = 0xffffffffffffffff;
      }
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      puVar13 = (ulong *)operator_new__(uVar15);
      __last._M_current =
           (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970);
      *puVar13 = uVar8;
      pQVar14 = (QLatin1String *)(puVar13 + 1);
      uVar19 = SUB86(pQVar14,0);
      uVar20 = (undefined2)((ulong)pQVar14 >> 0x30);
      if (uVar8 != 0) {
        uVar17 = SUB86(&pQVar14->m_size + uVar8,0);
        uVar18 = (undefined2)((ulong)(&pQVar14->m_size + uVar8) >> 0x30);
        do {
          in_stack_fffffffffffff960 = pQVar14;
          std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
          unique_ptr<std::default_delete<char_const[]>,void>
                    ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
                     in_stack_fffffffffffff950);
          __last._M_current =
               (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               &in_stack_fffffffffffff960->m_data;
          pQVar14 = (QLatin1String *)__last._M_current;
        } while (__last._M_current !=
                 (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
                 CONCAT26(uVar18,uVar17));
      }
      std::
      unique_ptr<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[],std::default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>>
      ::reset<std::unique_ptr<char_const[],std::default_delete<char_const[]>>*,void>
                ((unique_ptr<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[],_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
                  *)in_stack_fffffffffffff950,
                 (unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
                 CONCAT17(in_stack_fffffffffffff94f,
                          CONCAT16(in_stack_fffffffffffff94e,
                                   CONCAT15(in_stack_fffffffffffff94d,
                                            CONCAT14(in_stack_fffffffffffff94c,
                                                     in_stack_fffffffffffff948)))));
      this_00 = &local_a8;
      std::
      vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
      ::begin(this_00);
      std::
      vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
      ::end(this_00);
      __result = std::
                 unique_ptr<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[],_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
                 ::operator[]((unique_ptr<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[],_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
                               *)this_00,
                              CONCAT17(in_stack_fffffffffffff94f,
                                       CONCAT16(in_stack_fffffffffffff94e,
                                                CONCAT15(in_stack_fffffffffffff94d,
                                                         CONCAT14(in_stack_fffffffffffff94c,
                                                                  in_stack_fffffffffffff948)))));
      __first._M_current._6_2_ = uVar20;
      __first._M_current._0_6_ = uVar19;
      std::
      move<__gnu_cxx::__normal_iterator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>*,std::vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>>,std::unique_ptr<char_const[],std::default_delete<char_const[]>>*>
                (__first,__last,__result);
      QString::~QString((QString *)0x245eb1);
      std::
      vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
      ::~vector((vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                 *)in_stack_fffffffffffff960);
      QString::~QString((QString *)0x245ecb);
      QList<QString>::~QList((QList<QString> *)0x245ed8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::at((QList<QString> *)in_stack_fffffffffffff950,
                       CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,
                                         CONCAT15(in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
    QString::QString((QString *)in_stack_fffffffffffff950,
                     (QString *)
                     CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,
                                       CONCAT15(in_stack_fffffffffffff94d,
                                                CONCAT14(in_stack_fffffffffffff94c,
                                                         in_stack_fffffffffffff948)))));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950);
    s_03.m_size._4_4_ = in_stack_fffffffffffff974;
    s_03.m_size._0_4_ = in_stack_fffffffffffff970;
    s_03.m_data._0_6_ = in_stack_fffffffffffff978;
    s_03.m_data._6_2_ = in_stack_fffffffffffff97e.ucs;
    bVar4 = QString::startsWith((QString *)
                                CONCAT17(in_stack_fffffffffffff94f,
                                         CONCAT16(in_stack_fffffffffffff94e,
                                                  CONCAT15(in_stack_fffffffffffff94d,
                                                           CONCAT14(in_stack_fffffffffffff94c,
                                                                    in_stack_fffffffffffff948)))),
                                s_03,CaseInsensitive);
    if (bVar4) {
      QChar::QChar<char16_t,_true>(&local_da,L'}');
      bVar4 = QString::endsWith((QString *)in_stack_fffffffffffff958,in_stack_fffffffffffff96e,
                                (CaseSensitivity)((ulong)in_stack_fffffffffffff950 >> 0x20));
      if (!bVar4) goto LAB_00245b0f;
      QLatin1String::QLatin1String(in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
      bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                           (QLatin1StringView *)in_stack_fffffffffffff950);
      if (bVar4) {
        ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                            ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
                             in_stack_fffffffffffff950,
                             CONCAT17(in_stack_fffffffffffff94f,
                                      CONCAT16(in_stack_fffffffffffff94e,
                                               CONCAT15(in_stack_fffffffffffff94d,
                                                        CONCAT14(in_stack_fffffffffffff94c,
                                                                 in_stack_fffffffffffff948)))));
        *ppcVar9 = "%{type}";
      }
      else {
        QLatin1String::QLatin1String(in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
        bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                             (QLatin1StringView *)in_stack_fffffffffffff950);
        if (bVar4) {
          ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                    operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
                               in_stack_fffffffffffff950,
                               CONCAT17(in_stack_fffffffffffff94f,
                                        CONCAT16(in_stack_fffffffffffff94e,
                                                 CONCAT15(in_stack_fffffffffffff94d,
                                                          CONCAT14(in_stack_fffffffffffff94c,
                                                                   in_stack_fffffffffffff948)))));
          *ppcVar9 = "%{category}";
        }
        else {
          QLatin1String::QLatin1String(in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
          bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                               (QLatin1StringView *)in_stack_fffffffffffff950);
          if (bVar4) {
            ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                      operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *
                                 )in_stack_fffffffffffff950,
                                 CONCAT17(in_stack_fffffffffffff94f,
                                          CONCAT16(in_stack_fffffffffffff94e,
                                                   CONCAT15(in_stack_fffffffffffff94d,
                                                            CONCAT14(in_stack_fffffffffffff94c,
                                                                     in_stack_fffffffffffff948)))));
            *ppcVar9 = "%{message}";
          }
          else {
            QLatin1String::QLatin1String
                      (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
            bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                 (QLatin1StringView *)in_stack_fffffffffffff950);
            if (bVar4) {
              ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                        operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                    *)in_stack_fffffffffffff950,
                                   CONCAT17(in_stack_fffffffffffff94f,
                                            CONCAT16(in_stack_fffffffffffff94e,
                                                     CONCAT15(in_stack_fffffffffffff94d,
                                                              CONCAT14(in_stack_fffffffffffff94c,
                                                                       in_stack_fffffffffffff948))))
                                  );
              *ppcVar9 = "%{file}";
            }
            else {
              QLatin1String::QLatin1String
                        (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
              bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                   (QLatin1StringView *)in_stack_fffffffffffff950);
              if (bVar4) {
                ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                          operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                      *)in_stack_fffffffffffff950,
                                     CONCAT17(in_stack_fffffffffffff94f,
                                              CONCAT16(in_stack_fffffffffffff94e,
                                                       CONCAT15(in_stack_fffffffffffff94d,
                                                                CONCAT14(in_stack_fffffffffffff94c,
                                                                         in_stack_fffffffffffff948))
                                                      )));
                *ppcVar9 = "%{line}";
              }
              else {
                QLatin1String::QLatin1String
                          (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                     (QLatin1StringView *)in_stack_fffffffffffff950);
                if (bVar4) {
                  ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                            operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                        *)in_stack_fffffffffffff950,
                                       CONCAT17(in_stack_fffffffffffff94f,
                                                CONCAT16(in_stack_fffffffffffff94e,
                                                         CONCAT15(in_stack_fffffffffffff94d,
                                                                  CONCAT14(in_stack_fffffffffffff94c
                                                                           ,
                                                  in_stack_fffffffffffff948)))));
                  *ppcVar9 = "%{function}";
                }
                else {
                  QLatin1String::QLatin1String
                            (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                  bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                       (QLatin1StringView *)in_stack_fffffffffffff950);
                  if (bVar4) {
                    ppcVar9 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                              ::operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                            *)in_stack_fffffffffffff950,
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                    *ppcVar9 = "%{pid}";
                  }
                  else {
                    QLatin1String::QLatin1String
                              (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                    bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                         (QLatin1StringView *)in_stack_fffffffffffff950);
                    if (bVar4) {
                      ppcVar9 = std::
                                unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                                operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                            *)in_stack_fffffffffffff950,
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                      *ppcVar9 = "%{appname}";
                    }
                    else {
                      QLatin1String::QLatin1String
                                (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                      bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                           (QLatin1StringView *)in_stack_fffffffffffff950);
                      if (bVar4) {
                        ppcVar9 = std::
                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                                  operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                              *)in_stack_fffffffffffff950,
                                             CONCAT17(in_stack_fffffffffffff94f,
                                                      CONCAT16(in_stack_fffffffffffff94e,
                                                               CONCAT15(in_stack_fffffffffffff94d,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                        *ppcVar9 = "%{threadid}";
                      }
                      else {
                        QLatin1String::QLatin1String
                                  (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                        bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                             (QLatin1StringView *)in_stack_fffffffffffff950);
                        if (bVar4) {
                          ppcVar9 = std::
                                    unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                    ::operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                 CONCAT17(in_stack_fffffffffffff94f,
                                                          CONCAT16(in_stack_fffffffffffff94e,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                          *ppcVar9 = "%{threadname}";
                        }
                        else {
                          QLatin1String::QLatin1String
                                    (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                          bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                               (QLatin1StringView *)in_stack_fffffffffffff950);
                          if (bVar4) {
                            ppcVar9 = std::
                                      unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                      ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                            *ppcVar9 = "%{qthreadptr}";
                          }
                          else {
                            QLatin1String::QLatin1String
                                      (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
                            s_04.m_size._4_4_ = in_stack_fffffffffffff974;
                            s_04.m_size._0_4_ = in_stack_fffffffffffff970;
                            s_04.m_data._0_6_ = in_stack_fffffffffffff978;
                            s_04.m_data._6_2_ = in_stack_fffffffffffff97e.ucs;
                            bVar4 = QString::startsWith((QString *)
                                                        CONCAT17(in_stack_fffffffffffff94f,
                                                                 CONCAT16(in_stack_fffffffffffff94e,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))),s_04,
                                                  CaseInsensitive);
                            if (bVar4) {
                              ppcVar9 = std::
                                        unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                        ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                              *ppcVar9 = "%{time";
                              QChar::fromLatin1(in_stack_fffffffffffff94c);
                              qVar7 = QString::indexOf((QString *)in_stack_fffffffffffff958,
                                                       in_stack_fffffffffffff97e,
                                                       (qsizetype)in_stack_fffffffffffff950,
                                                       CONCAT13(in_stack_fffffffffffff94f,
                                                                CONCAT12(in_stack_fffffffffffff94e,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff94d,
                                                  in_stack_fffffffffffff94c))));
                              if (qVar7 < 1) {
                                QString::QString((QString *)0x244e80);
                                QList<QString>::append
                                          ((QList<QString> *)in_stack_fffffffffffff950,
                                           (rvalue_ref)
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                                QString::~QString((QString *)0x244ea4);
                              }
                              else {
                                QString::size(&local_d8);
                                QString::mid(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                                             in_stack_fffffffffffff988);
                                QList<QString>::append
                                          ((QList<QString> *)in_stack_fffffffffffff950,
                                           (rvalue_ref)
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                                QString::~QString((QString *)0x244e28);
                              }
                            }
                            else {
                              QLatin1String::QLatin1String
                                        (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958
                                        );
                              s_05.m_size._4_4_ = in_stack_fffffffffffff974;
                              s_05.m_size._0_4_ = in_stack_fffffffffffff970;
                              s_05.m_data._0_6_ = in_stack_fffffffffffff978;
                              s_05.m_data._6_2_ = in_stack_fffffffffffff97e.ucs;
                              bVar4 = QString::startsWith((QString *)
                                                          CONCAT17(in_stack_fffffffffffff94f,
                                                                   CONCAT16(
                                                  in_stack_fffffffffffff94e,
                                                  CONCAT15(in_stack_fffffffffffff94d,
                                                           CONCAT14(in_stack_fffffffffffff94c,
                                                                    in_stack_fffffffffffff948)))),
                                                  s_05,CaseInsensitive);
                              if (bVar4) {
                                ppcVar9 = std::
                                          unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                          ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                *ppcVar9 = "%{backtrace";
                                local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
                                local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
                                local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
                                QArrayDataPointer<char16_t>::QArrayDataPointer
                                          (&local_210,(Data *)0x0,L"|",1);
                                QString::QString((QString *)in_stack_fffffffffffff950,
                                                 (DataPointer *)
                                                 CONCAT17(in_stack_fffffffffffff94f,
                                                          CONCAT16(in_stack_fffffffffffff94e,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          (in_stack_fffffffffffff950);
                                local_214 = 5;
                                if (setPattern(QString_const&)::depthRx == '\0') {
                                  iVar6 = __cxa_guard_acquire(&setPattern(QString_const&)::depthRx);
                                  if (iVar6 != 0) {
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (local_248,(Data *)0x0,
                                               L" depth=(?|\"([^\"]*)\"|([^ }]*))",0x1d);
                                    QString::QString((QString *)in_stack_fffffffffffff950,
                                                     (DataPointer *)
                                                     CONCAT17(in_stack_fffffffffffff94f,
                                                              CONCAT16(in_stack_fffffffffffff94e,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                    QFlags<QRegularExpression::PatternOption>::QFlags
                                              ((QFlags<QRegularExpression::PatternOption> *)
                                               in_stack_fffffffffffff950,
                                               CONCAT13(in_stack_fffffffffffff94f,
                                                        CONCAT12(in_stack_fffffffffffff94e,
                                                                 CONCAT11(in_stack_fffffffffffff94d,
                                                                          in_stack_fffffffffffff94c)
                                                                )));
                                    QRegularExpression::QRegularExpression
                                              ((QRegularExpression *)in_stack_fffffffffffff980,
                                               (QString *)
                                               CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                        in_stack_fffffffffffff978),
                                               (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>
                                                )SUB84((ulong)in_stack_fffffffffffff988 >> 0x20,0));
                                    QString::~QString((QString *)0x2450c1);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                                              (in_stack_fffffffffffff950);
                                    __cxa_atexit(QRegularExpression::~QRegularExpression,
                                                 &setPattern::depthRx,&__dso_handle);
                                    __cxa_guard_release(&setPattern(QString_const&)::depthRx);
                                  }
                                }
                                if (setPattern(QString_const&)::separatorRx == '\0') {
                                  iVar6 = __cxa_guard_acquire(&setPattern(QString_const&)::
                                                               separatorRx);
                                  if (iVar6 != 0) {
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (local_280,(Data *)0x0,
                                               L" separator=(?|\"([^\"]*)\"|([^ }]*))",0x21);
                                    QString::QString((QString *)in_stack_fffffffffffff950,
                                                     (DataPointer *)
                                                     CONCAT17(in_stack_fffffffffffff94f,
                                                              CONCAT16(in_stack_fffffffffffff94e,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                    QFlags<QRegularExpression::PatternOption>::QFlags
                                              ((QFlags<QRegularExpression::PatternOption> *)
                                               in_stack_fffffffffffff950,
                                               CONCAT13(in_stack_fffffffffffff94f,
                                                        CONCAT12(in_stack_fffffffffffff94e,
                                                                 CONCAT11(in_stack_fffffffffffff94d,
                                                                          in_stack_fffffffffffff94c)
                                                                )));
                                    QRegularExpression::QRegularExpression
                                              ((QRegularExpression *)in_stack_fffffffffffff980,
                                               (QString *)
                                               CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                        in_stack_fffffffffffff978),
                                               (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>
                                                )SUB84((ulong)in_stack_fffffffffffff988 >> 0x20,0));
                                    QString::~QString((QString *)0x2451b3);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                                              (in_stack_fffffffffffff950);
                                    __cxa_atexit(QRegularExpression::~QRegularExpression,
                                                 &setPattern::separatorRx,&__dso_handle);
                                    __cxa_guard_release(&setPattern(QString_const&)::separatorRx);
                                  }
                                }
                                local_290 = &DAT_aaaaaaaaaaaaaaaa;
                                QFlags<QRegularExpression::MatchOption>::QFlags
                                          ((QFlags<QRegularExpression::MatchOption> *)
                                           in_stack_fffffffffffff950,
                                           CONCAT13(in_stack_fffffffffffff94f,
                                                    CONCAT12(in_stack_fffffffffffff94e,
                                                             CONCAT11(in_stack_fffffffffffff94d,
                                                                      in_stack_fffffffffffff94c))));
                                QRegularExpression::match
                                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                                           (qsizetype)in_stack_fffffffffffff9a0,
                                           (MatchType)((ulong)in_stack_fffffffffffff998 >> 0x20),
                                           (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                                           SUB84((ulong)in_stack_fffffffffffff9d8 >> 0x20,0));
                                bVar4 = QRegularExpressionMatch::hasMatch
                                                  ((QRegularExpressionMatch *)0x24524c);
                                iVar6 = local_214;
                                if (bVar4) {
                                  QVar16 = QRegularExpressionMatch::capturedView
                                                     ((QRegularExpressionMatch *)
                                                      CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                               in_stack_fffffffffffff978),
                                                      in_stack_fffffffffffff974);
                                  local_2a8 = QVar16;
                                  iVar6 = QStringView::toInt(in_stack_fffffffffffff958,
                                                             (bool *)in_stack_fffffffffffff950,
                                                             CONCAT13(in_stack_fffffffffffff94f,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff94e,
                                                  CONCAT11(in_stack_fffffffffffff94d,
                                                           in_stack_fffffffffffff94c))));
                                  if (iVar6 < 1) {
                                    Qt::Literals::StringLiterals::operator____L1
                                              ((char *)in_stack_fffffffffffff958,
                                               (size_t)in_stack_fffffffffffff950);
                                    s.m_data._0_6_ = in_stack_fffffffffffff968;
                                    s.m_size = (qsizetype)in_stack_fffffffffffff960;
                                    s.m_data._6_2_ = in_stack_fffffffffffff96e.ucs;
                                    QString::operator+=((QString *)
                                                        CONCAT17(in_stack_fffffffffffff94f,
                                                                 CONCAT16(in_stack_fffffffffffff94e,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))),s);
                                    iVar6 = local_214;
                                  }
                                }
                                local_214 = iVar6;
                                QFlags<QRegularExpression::MatchOption>::QFlags
                                          ((QFlags<QRegularExpression::MatchOption> *)
                                           in_stack_fffffffffffff950,
                                           CONCAT13(in_stack_fffffffffffff94f,
                                                    CONCAT12(in_stack_fffffffffffff94e,
                                                             CONCAT11(in_stack_fffffffffffff94d,
                                                                      in_stack_fffffffffffff94c))));
                                QRegularExpression::match
                                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                                           (qsizetype)in_stack_fffffffffffff9a0,
                                           (MatchType)((ulong)in_stack_fffffffffffff998 >> 0x20),
                                           (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                                           SUB84((ulong)in_stack_fffffffffffff9d8 >> 0x20,0));
                                QRegularExpressionMatch::operator=
                                          ((QRegularExpressionMatch *)in_stack_fffffffffffff950,
                                           (QRegularExpressionMatch *)
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                                QRegularExpressionMatch::~QRegularExpressionMatch
                                          ((QRegularExpressionMatch *)0x2454d0);
                                bVar4 = QRegularExpressionMatch::hasMatch
                                                  ((QRegularExpressionMatch *)0x2454dd);
                                if (bVar4) {
                                  QRegularExpressionMatch::captured
                                            ((QRegularExpressionMatch *)in_stack_fffffffffffff960,
                                             (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
                                  QString::operator=((QString *)in_stack_fffffffffffff950,
                                                     (QString *)
                                                     CONCAT17(in_stack_fffffffffffff94f,
                                                              CONCAT16(in_stack_fffffffffffff94e,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                  QString::~QString((QString *)0x245531);
                                }
                                local_18 = &DAT_aaaaaaaaaaaaaaaa;
                                puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
                                local_28 = &DAT_aaaaaaaaaaaaaaaa;
                                puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
                                BacktraceParams::BacktraceParams((BacktraceParams *)0x245564);
                                puStack_10 = (undefined1 *)CONCAT44(puStack_10._4_4_,local_214);
                                QString::operator=((QString *)in_stack_fffffffffffff950,
                                                   (QString *)
                                                   CONCAT17(in_stack_fffffffffffff94f,
                                                            CONCAT16(in_stack_fffffffffffff94e,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                QList<QMessagePattern::BacktraceParams>::append
                                          ((QList<QMessagePattern::BacktraceParams> *)
                                           in_stack_fffffffffffff950,
                                           (parameter_type)
                                           CONCAT17(in_stack_fffffffffffff94f,
                                                    CONCAT16(in_stack_fffffffffffff94e,
                                                             CONCAT15(in_stack_fffffffffffff94d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))));
                                piVar10 = qMax<int>((int *)(in_RDI + 0x48),&local_214);
                                *(int *)(in_RDI + 0x48) = *piVar10;
                                BacktraceParams::~BacktraceParams((BacktraceParams *)0x2455e7);
                                QRegularExpressionMatch::~QRegularExpressionMatch
                                          ((QRegularExpressionMatch *)0x2455f4);
                                QString::~QString((QString *)0x245601);
                              }
                              else {
                                QLatin1String::QLatin1String
                                          (in_stack_fffffffffffff960,
                                           (char *)in_stack_fffffffffffff958);
                                bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                     (QLatin1StringView *)in_stack_fffffffffffff950)
                                ;
                                if (bVar4) {
                                  if (bVar5) {
                                    bVar3 = true;
                                  }
                                  ppcVar9 = std::
                                            unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                            ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                  *ppcVar9 = "%{if-category}";
                                  bVar5 = true;
                                }
                                else {
                                  QLatin1String::QLatin1String
                                            (in_stack_fffffffffffff960,
                                             (char *)in_stack_fffffffffffff958);
                                  bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                       (QLatin1StringView *)
                                                       in_stack_fffffffffffff950);
                                  if (bVar4) {
                                    if (bVar5) {
                                      bVar3 = true;
                                    }
                                    ppcVar9 = std::
                                              unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                              ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                    *ppcVar9 = "%{if-debug}";
                                    bVar5 = true;
                                  }
                                  else {
                                    QLatin1String::QLatin1String
                                              (in_stack_fffffffffffff960,
                                               (char *)in_stack_fffffffffffff958);
                                    bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                         (QLatin1StringView *)
                                                         in_stack_fffffffffffff950);
                                    if (bVar4) {
                                      if (bVar5) {
                                        bVar3 = true;
                                      }
                                      ppcVar9 = std::
                                                unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                      *ppcVar9 = "%{if-info}";
                                      bVar5 = true;
                                    }
                                    else {
                                      QLatin1String::QLatin1String
                                                (in_stack_fffffffffffff960,
                                                 (char *)in_stack_fffffffffffff958);
                                      bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                           (QLatin1StringView *)
                                                           in_stack_fffffffffffff950);
                                      if (bVar4) {
                                        if (bVar5) {
                                          bVar3 = true;
                                        }
                                        ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                        *ppcVar9 = "%{if-warning}";
                                        bVar5 = true;
                                      }
                                      else {
                                        QLatin1String::QLatin1String
                                                  (in_stack_fffffffffffff960,
                                                   (char *)in_stack_fffffffffffff958);
                                        bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                             (QLatin1StringView *)
                                                             in_stack_fffffffffffff950);
                                        if (bVar4) {
                                          if (bVar5) {
                                            bVar3 = true;
                                          }
                                          ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                          *ppcVar9 = "%{if-critical}";
                                          bVar5 = true;
                                        }
                                        else {
                                          QLatin1String::QLatin1String
                                                    (in_stack_fffffffffffff960,
                                                     (char *)in_stack_fffffffffffff958);
                                          bVar4 = ::operator==((QString *)in_stack_fffffffffffff958,
                                                               (QLatin1StringView *)
                                                               in_stack_fffffffffffff950);
                                          if (bVar4) {
                                            if (bVar5) {
                                              bVar3 = true;
                                            }
                                            in_stack_fffffffffffff9d8 =
                                                 std::
                                                 unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                 ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                            *in_stack_fffffffffffff9d8 = "%{if-fatal}";
                                            bVar5 = true;
                                          }
                                          else {
                                            QLatin1String::QLatin1String
                                                      (in_stack_fffffffffffff960,
                                                       (char *)in_stack_fffffffffffff958);
                                            bVar4 = ::operator==((QString *)
                                                                 in_stack_fffffffffffff958,
                                                                 (QLatin1StringView *)
                                                                 in_stack_fffffffffffff950);
                                            if (bVar4) {
                                              ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                              *ppcVar9 = "%{endif}";
                                              if ((!bVar5) && (!bVar3)) {
                                                Qt::Literals::StringLiterals::operator____L1
                                                          ((char *)in_stack_fffffffffffff958,
                                                           (size_t)in_stack_fffffffffffff950);
                                                s_00.m_data._0_6_ = in_stack_fffffffffffff968;
                                                s_00.m_size = (qsizetype)in_stack_fffffffffffff960;
                                                s_00.m_data._6_2_ = in_stack_fffffffffffff96e.ucs;
                                                QString::operator+=((QString *)
                                                                    CONCAT17(
                                                  in_stack_fffffffffffff94f,
                                                  CONCAT16(in_stack_fffffffffffff94e,
                                                           CONCAT15(in_stack_fffffffffffff94d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff94c,
                                                  in_stack_fffffffffffff948)))),s_00);
                                              }
                                              bVar5 = false;
                                            }
                                            else {
                                              ppcVar9 = std::
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  ::operator[]((
                                                  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                                  *)in_stack_fffffffffffff950,
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                              *ppcVar9 = "";
                                              local_368 = Qt::Literals::StringLiterals::
                                                          operator____L1((char *)
                                                  in_stack_fffffffffffff958,
                                                  (size_t)in_stack_fffffffffffff950);
                                              ::operator+((QLatin1String *)in_stack_fffffffffffff950
                                                          ,(QString *)
                                                           CONCAT17(in_stack_fffffffffffff94f,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffff94e,
                                                  CONCAT15(in_stack_fffffffffffff94d,
                                                           CONCAT14(in_stack_fffffffffffff94c,
                                                                    in_stack_fffffffffffff948)))));
                                              local_369 = (char)Qt::Literals::StringLiterals::
                                                                operator____L1(
                                                  in_stack_fffffffffffff94e);
                                              ::operator+((
                                                  QStringBuilder<QLatin1String,_const_QString_&> *)
                                                  in_stack_fffffffffffff950,
                                                  (QLatin1Char *)
                                                  CONCAT17(in_stack_fffffffffffff94f,
                                                           CONCAT16(in_stack_fffffffffffff94e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff94d,
                                                  CONCAT14(in_stack_fffffffffffff94c,
                                                           in_stack_fffffffffffff948)))));
                                              ::operator+=(in_stack_fffffffffffff980,
                                                           (
                                                  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char>
                                                  *)CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                             in_stack_fffffffffffff978));
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
LAB_00245b0f:
      QString::toLatin1((QString *)
                        CONCAT17(in_stack_fffffffffffff94f,
                                 CONCAT16(in_stack_fffffffffffff94e,
                                          CONCAT15(in_stack_fffffffffffff94d,
                                                   CONCAT14(in_stack_fffffffffffff94c,
                                                            in_stack_fffffffffffff948)))));
      QByteArray::constData((QByteArray *)0x245b33);
      qstrdup((char *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,
                                        CONCAT15(in_stack_fffffffffffff94d,
                                                 CONCAT14(in_stack_fffffffffffff94c,
                                                          in_stack_fffffffffffff948)))));
      in_stack_fffffffffffff9b0 = &local_378;
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff950,
                 (char *)CONCAT17(in_stack_fffffffffffff94f,
                                  CONCAT16(in_stack_fffffffffffff94e,
                                           CONCAT15(in_stack_fffffffffffff94d,
                                                    CONCAT14(in_stack_fffffffffffff94c,
                                                             in_stack_fffffffffffff948)))));
      std::
      vector<std::unique_ptr<char_const[],std::default_delete<char_const[]>>,std::allocator<std::unique_ptr<char_const[],std::default_delete<char_const[]>>>>
      ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                ((vector<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>,_std::allocator<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>_>_>
                  *)in_stack_fffffffffffff960,
                 (unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff958);
      in_stack_fffffffffffff9a0 =
           (Data *)std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
                             ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
                              in_stack_fffffffffffff950);
      in_stack_fffffffffffff9a8 =
           (QString *)
           std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                     ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
                      in_stack_fffffffffffff950,
                      CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,
                                        CONCAT15(in_stack_fffffffffffff94d,
                                                 CONCAT14(in_stack_fffffffffffff94c,
                                                          in_stack_fffffffffffff948)))));
      (in_stack_fffffffffffff9a8->d).d = in_stack_fffffffffffff9a0;
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff950);
      QByteArray::~QByteArray((QByteArray *)0x245bc8);
    }
    QString::~QString((QString *)0x245c25);
    local_42c = local_42c + 1;
  } while( true );
}

Assistant:

void QMessagePattern::setPattern(const QString &pattern)
{
    timeArgs.clear();
#ifdef QLOGGING_HAVE_BACKTRACE
    backtraceArgs.clear();
    maxBacktraceDepth = 0;
#endif

    // scanner
    QList<QString> lexemes;
    QString lexeme;
    bool inPlaceholder = false;
    for (int i = 0; i < pattern.size(); ++i) {
        const QChar c = pattern.at(i);
        if (c == u'%' && !inPlaceholder) {
            if ((i + 1 < pattern.size())
                    && pattern.at(i + 1) == u'{') {
                // beginning of placeholder
                if (!lexeme.isEmpty()) {
                    lexemes.append(lexeme);
                    lexeme.clear();
                }
                inPlaceholder = true;
            }
        }

        lexeme.append(c);

        if (c == u'}' && inPlaceholder) {
            // end of placeholder
            lexemes.append(lexeme);
            lexeme.clear();
            inPlaceholder = false;
        }
    }
    if (!lexeme.isEmpty())
        lexemes.append(lexeme);

    // tokenizer
    std::vector<std::unique_ptr<const char[]>> literalsVar;
    tokens.reset(new const char *[lexemes.size() + 1]);
    tokens[lexemes.size()] = nullptr;

    bool nestedIfError = false;
    bool inIf = false;
    QString error;

    for (int i = 0; i < lexemes.size(); ++i) {
        const QString lexeme = lexemes.at(i);
        if (lexeme.startsWith("%{"_L1) && lexeme.endsWith(u'}')) {
            // placeholder
            if (lexeme == QLatin1StringView(typeTokenC)) {
                tokens[i] = typeTokenC;
            } else if (lexeme == QLatin1StringView(categoryTokenC))
                tokens[i] = categoryTokenC;
            else if (lexeme == QLatin1StringView(messageTokenC))
                tokens[i] = messageTokenC;
            else if (lexeme == QLatin1StringView(fileTokenC))
                tokens[i] = fileTokenC;
            else if (lexeme == QLatin1StringView(lineTokenC))
                tokens[i] = lineTokenC;
            else if (lexeme == QLatin1StringView(functionTokenC))
                tokens[i] = functionTokenC;
            else if (lexeme == QLatin1StringView(pidTokenC))
                tokens[i] = pidTokenC;
            else if (lexeme == QLatin1StringView(appnameTokenC))
                tokens[i] = appnameTokenC;
            else if (lexeme == QLatin1StringView(threadidTokenC))
                tokens[i] = threadidTokenC;
            else if (lexeme == QLatin1StringView(threadnameTokenC))
                tokens[i] = threadnameTokenC;
            else if (lexeme == QLatin1StringView(qthreadptrTokenC))
                tokens[i] = qthreadptrTokenC;
            else if (lexeme.startsWith(QLatin1StringView(timeTokenC))) {
                tokens[i] = timeTokenC;
                qsizetype spaceIdx = lexeme.indexOf(QChar::fromLatin1(' '));
                if (spaceIdx > 0)
                    timeArgs.append(lexeme.mid(spaceIdx + 1, lexeme.size() - spaceIdx - 2));
                else
                    timeArgs.append(QString());
            } else if (lexeme.startsWith(QLatin1StringView(backtraceTokenC))) {
#ifdef QLOGGING_HAVE_BACKTRACE
                tokens[i] = backtraceTokenC;
                QString backtraceSeparator = QStringLiteral("|");
                int backtraceDepth = 5;
                static const QRegularExpression depthRx(QStringLiteral(" depth=(?|\"([^\"]*)\"|([^ }]*))"));
                static const QRegularExpression separatorRx(QStringLiteral(" separator=(?|\"([^\"]*)\"|([^ }]*))"));
                QRegularExpressionMatch m = depthRx.match(lexeme);
                if (m.hasMatch()) {
                    int depth = m.capturedView(1).toInt();
                    if (depth <= 0)
                        error += "QT_MESSAGE_PATTERN: %{backtrace} depth must be a number greater than 0\n"_L1;
                    else
                        backtraceDepth = depth;
                }
                m = separatorRx.match(lexeme);
                if (m.hasMatch())
                    backtraceSeparator = m.captured(1);
                BacktraceParams backtraceParams;
                backtraceParams.backtraceDepth = backtraceDepth;
                backtraceParams.backtraceSeparator = backtraceSeparator;
                backtraceArgs.append(backtraceParams);
                maxBacktraceDepth = qMax(maxBacktraceDepth, backtraceDepth);
#else
                error += "QT_MESSAGE_PATTERN: %{backtrace} is not supported by this Qt build\n"_L1;
                tokens[i] = "";
#endif
            }

#define IF_TOKEN(LEVEL) \
            else if (lexeme == QLatin1StringView(LEVEL)) { \
                if (inIf) \
                    nestedIfError = true; \
                tokens[i] = LEVEL; \
                inIf = true; \
            }
            IF_TOKEN(ifCategoryTokenC)
            IF_TOKEN(ifDebugTokenC)
            IF_TOKEN(ifInfoTokenC)
            IF_TOKEN(ifWarningTokenC)
            IF_TOKEN(ifCriticalTokenC)
            IF_TOKEN(ifFatalTokenC)
#undef IF_TOKEN
            else if (lexeme == QLatin1StringView(endifTokenC)) {
                tokens[i] = endifTokenC;
                if (!inIf && !nestedIfError)
                    error += "QT_MESSAGE_PATTERN: %{endif} without an %{if-*}\n"_L1;
                inIf = false;
            } else {
                tokens[i] = emptyTokenC;
                error += "QT_MESSAGE_PATTERN: Unknown placeholder "_L1 + lexeme + '\n'_L1;
            }
        } else {
            using UP = std::unique_ptr<char[]>;
            tokens[i] = literalsVar.emplace_back(UP(qstrdup(lexeme.toLatin1().constData()))).get();
        }